

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockResult.cxx
# Opt level: O0

string * __thiscall
cmFileLockResult::GetOutputMessage_abi_cxx11_(string *__return_storage_ptr__,cmFileLockResult *this)

{
  char *pcVar1;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  cmFileLockResult *local_18;
  cmFileLockResult *this_local;
  
  local_18 = this;
  this_local = (cmFileLockResult *)__return_storage_ptr__;
  switch(this->Type) {
  case OK:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case SYSTEM:
    pcVar1 = strerror(this->ErrorValue);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case TIMEOUT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Timeout reached",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case ALREADY_LOCKED:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"File already locked",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case INTERNAL:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Internal error",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case NO_FUNCTION:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\'GUARD FUNCTION\' not used in function definition"
               ,&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileLockResult::GetOutputMessage() const
{
  switch (this->Type) {
    case OK:
      return "0";
    case SYSTEM:
#if defined(_WIN32)
    {
      char winmsg[WINMSG_BUF_LEN];
      DWORD flags = FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS;
      if (FormatMessageA(flags, NULL, this->ErrorValue,
                         MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
                         (LPSTR)winmsg, WINMSG_BUF_LEN, NULL)) {
        const std::string message = winmsg;
        return message;
      } else {
        return "Internal error (FormatMessageA failed)";
      }
    }
#else
      return strerror(this->ErrorValue);
#endif
    case TIMEOUT:
      return "Timeout reached";
    case ALREADY_LOCKED:
      return "File already locked";
    case NO_FUNCTION:
      return "'GUARD FUNCTION' not used in function definition";
    case INTERNAL:
    default:
      return "Internal error";
  }
}